

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::SSARewriter::AddPhiOperands(SSARewriter *this,PhiCandidate *phi_candidate)

{
  uint32_t *puVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *bb;
  PhiCandidate *this_00;
  uint32_t *puVar7;
  uint32_t arg_id;
  uint32_t local_44;
  PhiCandidate *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_40 = phi_candidate;
  if ((phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar5 = Pass::cfg(&this->pass_->super_Pass);
    uVar4 = BasicBlock::id(phi_candidate->bb_);
    pvVar6 = CFG::preds(pCVar5,uVar4);
    puVar1 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_38 = &phi_candidate->phi_args_;
    bVar3 = false;
    for (puVar7 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
      uVar4 = *puVar7;
      pCVar5 = Pass::cfg(&this->pass_->super_Pass);
      bb = CFG::block(pCVar5,uVar4);
      bVar2 = IsBlockSealed(this,bb);
      uVar4 = 0;
      if (bVar2) {
        uVar4 = GetReachingDef(this,phi_candidate->var_id_,bb);
      }
      local_44 = uVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_38,&local_44);
      if (local_44 == 0) {
        bVar3 = true;
      }
      else {
        this_00 = GetPhiCandidate(this,local_44);
        if (this_00 != phi_candidate && this_00 != (PhiCandidate *)0x0) {
          PhiCandidate::AddUser(this_00,phi_candidate->result_id_);
        }
      }
    }
    if (bVar3) {
      phi_candidate->is_complete_ = false;
      std::
      deque<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
      ::push_back(&(this->incomplete_phis_).c,&local_40);
      uVar4 = local_40->result_id_;
    }
    else {
      uVar4 = TryRemoveTrivialPhi(this,phi_candidate);
      if (uVar4 == local_40->result_id_) {
        local_40->is_complete_ = true;
        std::
        vector<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
        ::push_back(&this->phis_to_generate_,&local_40);
      }
    }
    return uVar4;
  }
  __assert_fail("phi_candidate->phi_args().size() == 0 && \"Phi candidate already has arguments\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                ,0xa7,"uint32_t spvtools::opt::SSARewriter::AddPhiOperands(PhiCandidate *)");
}

Assistant:

uint32_t SSARewriter::AddPhiOperands(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() == 0 &&
         "Phi candidate already has arguments");

  bool found_0_arg = false;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);

    // If |pred_bb| is not sealed, use %0 to indicate that
    // |phi_candidate| needs to be completed after the whole CFG has
    // been processed.
    //
    // Note that we cannot call GetReachingDef() in these cases
    // because this would generate an empty Phi candidate in
    // |pred_bb|.  When |pred_bb| is later processed, a new definition
    // for |phi_candidate->var_id_| will be lost because
    // |phi_candidate| will still be reached by the empty Phi.
    //
    // Consider:
    //
    //       BB %23:
    //           %38 = Phi[%i](%int_0[%1], %39[%25])
    //
    //           ...
    //
    //       BB %25: [Starts unsealed]
    //       %39 = Phi[%i]()
    //       %34 = ...
    //       OpStore %i %34    -> Currdef(%i) at %25 is %34
    //       OpBranch %23
    //
    // When we first create the Phi in %38, we add an operandless Phi in
    // %39 to hold the unknown reaching def for %i.
    //
    // But then, when we go to complete %39 at the end.  The reaching def
    // for %i in %25's predecessor is %38 itself.  So we miss the fact
    // that %25 has a def for %i that should be used.
    //
    // By making the argument %0, we make |phi_candidate| incomplete,
    // which will cause it to be completed after the whole CFG has
    // been scanned.
    uint32_t arg_id = IsBlockSealed(pred_bb)
                          ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                          : 0;
    phi_candidate->phi_args().push_back(arg_id);

    if (arg_id == 0) {
      found_0_arg = true;
    } else {
      // If this argument is another Phi candidate, add |phi_candidate| to the
      // list of users for the defining Phi.
      PhiCandidate* defining_phi = GetPhiCandidate(arg_id);
      if (defining_phi && defining_phi != phi_candidate) {
        defining_phi->AddUser(phi_candidate->result_id());
      }
    }
  }

  // If we could not fill-in all the arguments of this Phi, mark it incomplete
  // so it gets completed after the whole CFG has been processed.
  if (found_0_arg) {
    phi_candidate->MarkIncomplete();
    incomplete_phis_.push(phi_candidate);
    return phi_candidate->result_id();
  }

  // Try to remove |phi_candidate|, if it's trivial.
  uint32_t repl_id = TryRemoveTrivialPhi(phi_candidate);
  if (repl_id == phi_candidate->result_id()) {
    // |phi_candidate| is complete and not trivial.  Add it to the
    // list of Phi candidates to generate.
    phi_candidate->MarkComplete();
    phis_to_generate_.push_back(phi_candidate);
  }

  return repl_id;
}